

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<false>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
::assert_word_matcher
          (assert_word_matcher<boost::xpressive::detail::word_boundary<mpl_::bool_<false>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_class_type cVar1;
  
  cVar1 = lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,2ul>
                    (tr,(char (*) [2])"w",false);
  this->word_ = cVar1;
  return;
}

Assistant:

assert_word_matcher(Traits const &tr)
          : word_(lookup_classname(tr, "w"))
        {
            BOOST_ASSERT(0 != this->word_);
        }